

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

void AddCoins(CCoinsViewCache *cache,CTransaction *tx,int nHeight,bool check_for_overwrite)

{
  bool bVar1;
  undefined1 possible_overwrite;
  ulong uVar3;
  pointer pCVar4;
  long lVar5;
  long in_FS_OFFSET;
  Coin local_98;
  COutPoint local_68;
  long local_38;
  int iVar2;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CTransaction::IsCoinBase(tx);
  pCVar4 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish != pCVar4) {
    lVar5 = 8;
    uVar3 = 0;
    do {
      possible_overwrite = bVar1;
      if (check_for_overwrite) {
        local_98.out.nValue = *(CAmount *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
        ;
        local_98.out.scriptPubKey.super_CScriptBase._union._0_4_ =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
        local_98.out.scriptPubKey.super_CScriptBase._union._4_4_ =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0xc);
        local_98.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        local_98.out.scriptPubKey.super_CScriptBase._union._12_4_ =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14);
        local_98.out.scriptPubKey.super_CScriptBase._union._16_4_ =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        local_98.out.scriptPubKey.super_CScriptBase._union._20_4_ =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c);
        local_98.out.scriptPubKey.super_CScriptBase._union._24_4_ = (uint32_t)uVar3;
        iVar2 = (*(cache->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                          (cache,&local_98);
        possible_overwrite = (undefined1)iVar2;
        pCVar4 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      local_98.out.nValue = *(CAmount *)((long)pCVar4 + lVar5 + -8);
      local_68.n = (uint32_t)uVar3;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                (&local_98.out.scriptPubKey.super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)((long)&pCVar4->nValue + lVar5)
                );
      local_98._40_4_ = (uint)bVar1 + nHeight * 2;
      CCoinsViewCache::AddCoin(cache,&local_68,&local_98,(bool)possible_overwrite);
      if (0x1c < local_98.out.scriptPubKey.super_CScriptBase._size) {
        free((void *)CONCAT44(local_98.out.scriptPubKey.super_CScriptBase._union._4_4_,
                              local_98.out.scriptPubKey.super_CScriptBase._union._0_4_));
      }
      uVar3 = uVar3 + 1;
      pCVar4 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x28;
    } while (uVar3 < (ulong)(((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) *
                            -0x3333333333333333));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddCoins(CCoinsViewCache& cache, const CTransaction &tx, int nHeight, bool check_for_overwrite) {
    bool fCoinbase = tx.IsCoinBase();
    const Txid& txid = tx.GetHash();
    for (size_t i = 0; i < tx.vout.size(); ++i) {
        bool overwrite = check_for_overwrite ? cache.HaveCoin(COutPoint(txid, i)) : fCoinbase;
        // Coinbase transactions can always be overwritten, in order to correctly
        // deal with the pre-BIP30 occurrences of duplicate coinbase transactions.
        cache.AddCoin(COutPoint(txid, i), Coin(tx.vout[i], nHeight, fCoinbase), overwrite);
    }
}